

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_cli_req_callback
          (raft_server *this,ptr<commit_ret_elem> *elem,ptr<resp_msg> *resp)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  long *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
  pVar9;
  ptr<resp_msg> pVar10;
  ptr<buffer> ret_value;
  _Alloc_hider local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var1 = elem[0x31].
           super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
    if (4 < iVar7) {
      p_Var1 = elem[0x31].
               super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)&stack0xffffffffffffff78,"commit_ret_cv %lu %p sleep",
                 (peVar2->super_msg_base)._vptr_msg_base,&(peVar2->super_msg_base).term_);
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"handle_cli_req_callback",0xd4,&stack0xffffffffffffff78);
      if ((element_type *)local_88._M_p != (element_type *)&stack0xffffffffffffff88) {
        operator_delete(local_88._M_p);
      }
    }
  }
  peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  context::get_params((context *)&stack0xffffffffffffff78);
  EventAwaiter::wait_us
            ((EventAwaiter *)&(peVar2->super_msg_base).term_,
             (long)*(int *)(local_88._M_p + 0x2c) * 1000);
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &elem[0x50].
             super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar2->super_msg_base)._vptr_msg_base;
  local_48 = (element_type *)
             timer_helper::get_us
                       ((timer_helper *)&(peVar2->cb_func_).super__Function_base._M_manager);
  peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2[1].super_msg_base.term_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&stack0xffffffffffffffa0,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&peVar2[1].super_msg_base.type_);
  peVar2 = (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar2[1].accepted_ = true;
  if (peVar2[1].super_msg_base.dst_ == -2) {
    p_Var1 = elem[0x31].
             super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
      if (4 < iVar7) {
        p_Var1 = elem[0x31].
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)&stack0xffffffffffffff78,
                   "Client timeout leave commit thread to remove commit_ret_elem %lu",local_50._M_pi
                  );
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"handle_cli_req_callback",0xe5,&stack0xffffffffffffff78);
        if ((element_type *)local_88._M_p != (element_type *)&stack0xffffffffffffff88) {
          operator_delete(local_88._M_p);
        }
      }
    }
  }
  else {
    this_00 = &elem[0x4d].
               super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    pVar9 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
            ::equal_range((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                           *)this_00,(key_type *)peVar2);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
    ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                    *)this_00,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node);
  }
  p_Var1 = elem[0x31].
           super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
    if (4 < iVar7) {
      p_Var1 = elem[0x31].
               super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      msg_if_given_abi_cxx11_
                ((string *)&stack0xffffffffffffff78,"remaining elems in waiting queue: %zu",
                 elem[0x50].
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"handle_cli_req_callback",0xe7,&stack0xffffffffffffff78);
      if ((element_type *)local_88._M_p != (element_type *)&stack0xffffffffffffff88) {
        operator_delete(local_88._M_p);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  p_Var1 = elem[0x31].
           super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
      super_msg_base.dst_ == 0) {
    if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002194b4;
    iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
    if (iVar7 < 5) goto LAB_002194b4;
    p_Var1 = elem[0x31].
             super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    msg_if_given_abi_cxx11_
              ((string *)&stack0xffffffffffffff78,
               "[OK] commit_ret_cv %lu wake up (%lu us), return value %p",local_50._M_pi,local_48,
               local_68);
    (*p_Var1->_vptr__Sp_counted_base[8])
              (p_Var1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
               ,"handle_cli_req_callback",0xec,&stack0xffffffffffffff78);
  }
  else {
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
      if (2 < iVar7) {
        p_Var1 = elem[0x31].
                 super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)&stack0xffffffffffffff78,
                   "[NOT OK] commit_ret_cv %lu wake up (%lu us), return value %p, result code %d",
                   local_50._M_pi,local_48,local_68,
                   (ulong)(uint)(resp->
                                super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr[1].super_msg_base.dst_);
        (*p_Var1->_vptr__Sp_counted_base[8])
                  (p_Var1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"handle_cli_req_callback",0xf1,&stack0xffffffffffffff78);
        if ((element_type *)local_88._M_p != (element_type *)&stack0xffffffffffffff88) {
          operator_delete(local_88._M_p);
        }
      }
    }
    bVar6 = check_leadership_validity((raft_server *)elem);
    p_Var1 = elem[0x31].
             super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (bVar6) {
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002194b4;
      iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
      if (iVar7 < 4) goto LAB_002194b4;
      p_Var1 = elem[0x31].
               super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      msg_if_given_abi_cxx11_((string *)&stack0xffffffffffffff78,"leadership is still valid");
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"handle_cli_req_callback",0xf4,&stack0xffffffffffffff78);
    }
    else {
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_002194b4;
      iVar7 = (*p_Var1->_vptr__Sp_counted_base[7])();
      if (iVar7 < 2) goto LAB_002194b4;
      p_Var1 = elem[0x31].
               super___shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      msg_if_given_abi_cxx11_((string *)&stack0xffffffffffffff78,"leadership is invalid");
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                 ,"handle_cli_req_callback",0xf6,&stack0xffffffffffffff78);
    }
  }
  if ((element_type *)local_88._M_p != (element_type *)&stack0xffffffffffffff88) {
    operator_delete(local_88._M_p);
  }
LAB_002194b4:
  lVar3 = *in_RCX;
  local_40._M_pi = local_68;
  local_38._M_pi = _Stack_60._M_pi;
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
    }
  }
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x38) = local_68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x40),&stack0xffffffffffffffc8);
  _Var8._M_pi = extraout_RDX;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var8._M_pi = extraout_RDX_00;
  }
  pp_Var4 = (_func_int **)*in_RCX;
  *(int32 *)(pp_Var4 + 0x13) =
       (resp->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
       super_msg_base.dst_;
  this->_vptr_raft_server = pp_Var4;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  peVar5 = (element_type *)in_RCX[1];
  in_RCX[1] = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  *in_RCX = 0;
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    _Var8._M_pi = extraout_RDX_01;
  }
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar10.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req_callback(ptr<commit_ret_elem> elem,
                                                   ptr<resp_msg> resp) {
    p_dv("commit_ret_cv %" PRIu64 " %p sleep", elem->idx_, &elem->awaiter_);

    // Will wake up after timeout.
    elem->awaiter_.wait_ms(ctx_->get_params()->client_req_timeout_);

    uint64_t idx = 0;
    uint64_t elapsed_us = 0;
    ptr<buffer> ret_value = nullptr;
    {   auto_lock(commit_ret_elems_lock_);
        idx = elem->idx_;
        elapsed_us = elem->timer_.get_us();
        ret_value = elem->ret_value_;
        elem->callback_invoked_ = true;
        if (elem->result_code_ != cmd_result_code::TIMEOUT) {
            commit_ret_elems_.erase(elem->idx_);
        } else {
            p_dv("Client timeout leave commit thread to remove commit_ret_elem %" PRIu64,
                 idx);
        }
        p_dv("remaining elems in waiting queue: %zu", commit_ret_elems_.size());
    }

    if (elem->result_code_ == cmd_result_code::OK) {
        p_dv( "[OK] commit_ret_cv %" PRIu64 " wake up (%" PRIu64 " us), return value %p",
              idx, elapsed_us, ret_value.get() );
    } else {
        // Null `ret_value`, most likely timeout.
        p_wn( "[NOT OK] commit_ret_cv %" PRIu64 " wake up (%" PRIu64 " us), "
              "return value %p, result code %d",
              idx, elapsed_us, ret_value.get(), elem->result_code_ );
        bool valid_leader = check_leadership_validity();
        if (valid_leader) {
            p_in("leadership is still valid");
        } else {
            p_er("leadership is invalid");
        }
    }
    resp->set_ctx(ret_value);
    resp->set_result_code(elem->result_code_);

    return resp;
}